

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O1

void Smt_PrsReadLines(Smt_Prs_t *p)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  byte *pbVar11;
  byte *pbVar12;
  
  if ((p->vStack).nSize != 0) {
    __assert_fail("Vec_IntSize(&p->vStack) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x674,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if ((p->vObjs).nSize != 0) {
    __assert_fail("Vec_WecSize(&p->vObjs) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x676,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  Vec_IntPush(&p->vStack,0);
  Vec_WecPushLevel(&p->vObjs);
  pbVar11 = (byte *)p->pBuffer;
  pbVar6 = (byte *)p->pLimit;
  p->pCur = (char *)pbVar11;
  if (pbVar11 < pbVar6) {
    bVar3 = true;
    do {
      while( true ) {
        if ((0x20 < (ulong)*pbVar11) || ((0x100002600U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))
        break;
        p->pCur = (char *)(pbVar11 + 1);
        pbVar11 = pbVar11 + 1;
      }
      if ((bVar3) && (pcVar10 = p->pCur, *pcVar10 == '|')) {
        while( true ) {
          *pcVar10 = ' ';
          pcVar10 = p->pCur;
          if (*pcVar10 == '\0') break;
          if (*pcVar10 == '|') {
            *pcVar10 = ' ';
            break;
          }
          p->pCur = pcVar10 + 1;
        }
        bVar3 = false;
      }
      else {
        pbVar11 = (byte *)p->pCur;
        if (*pbVar11 == 0x29) {
          iVar4 = (p->vStack).nSize;
          if (iVar4 < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x3ba,"int Vec_IntPop(Vec_Int_t *)");
          }
          (p->vStack).nSize = iVar4 + -1;
        }
        else if (*pbVar11 == 0x28) {
          lVar7 = (long)(p->vStack).nSize;
          if (lVar7 < 1) {
LAB_0034e174:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x201,"int Vec_IntEntryLast(Vec_Int_t *)");
          }
          iVar4 = (p->vStack).pArray[lVar7 + -1];
          if (((long)iVar4 < 0) || (iVar2 = (p->vObjs).nSize, iVar2 <= iVar4)) {
LAB_0034e136:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if (iVar2 < 0) {
LAB_0034e155:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush((p->vObjs).pArray + iVar4,iVar2 * 2);
          Vec_IntPush(&p->vStack,(p->vObjs).nSize);
          Vec_WecPushLevel(&p->vObjs);
        }
        else {
          pbVar12 = pbVar11;
          if (pbVar11 < pbVar6) {
            do {
              bVar1 = *pbVar12;
              if (((bVar1 & 0xfe) == 0x28) ||
                 ((bVar1 < 0x21 & (byte)(0x100002600 >> (bVar1 & 0x3f))) != 0)) break;
              pbVar12 = pbVar12 + 1;
              p->pCur = (char *)pbVar12;
            } while (pbVar12 != pbVar6);
          }
          pbVar12 = (byte *)p->pCur;
          if (pbVar12 < pbVar6) {
            p->pCur = (char *)(pbVar12 + -1);
            iVar4 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar11,(char *)pbVar12,(int *)0x0);
            lVar7 = (long)(p->vStack).nSize;
            if (lVar7 < 1) goto LAB_0034e174;
            iVar2 = (p->vStack).pArray[lVar7 + -1];
            if (((long)iVar2 < 0) || ((p->vObjs).nSize <= iVar2)) goto LAB_0034e136;
            if (iVar4 < 0) goto LAB_0034e155;
            Vec_IntPush((p->vObjs).pArray + iVar2,iVar4 * 2 + 1);
          }
        }
      }
      pbVar6 = (byte *)p->pLimit;
      pbVar11 = (byte *)(p->pCur + 1);
      p->pCur = (char *)pbVar11;
    } while (pbVar11 < pbVar6);
  }
  if ((p->vStack).nSize != 1) {
    __assert_fail("Vec_IntSize(&p->vStack) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x6b1,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  uVar9 = (p->vObjs).nSize;
  if (uVar9 != (p->vObjs).nCap) {
    __assert_fail("Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x6b2,"void Smt_PrsReadLines(Smt_Prs_t *)");
  }
  if (1 < uVar9) {
    uVar8 = 0;
    uVar5 = uVar9 - 1;
    uVar9 = uVar8;
    if (uVar5 != 0) {
      do {
        uVar9 = uVar8 + 1;
        bVar3 = 0xf < uVar5;
        uVar8 = uVar9;
        uVar5 = uVar5 >> 4;
      } while (bVar3);
    }
  }
  p->nDigits = uVar9;
  return;
}

Assistant:

void Smt_PrsReadLines( Smt_Prs_t * p )
{
    int fFirstTime = 1;
    assert( Vec_IntSize(&p->vStack) == 0 );
    //assert( Vec_WecSize(&p->vDepth) == 0 );
    assert( Vec_WecSize(&p->vObjs) == 0 );
    // add top node at level 0
    //Vec_WecPushLevel( &p->vDepth );
    //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
    // add top node
    Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
    Vec_WecPushLevel( &p->vObjs );
    // add other nodes
    for ( p->pCur = p->pBuffer; p->pCur < p->pLimit; p->pCur++ )
    {
        Smt_PrsSkipSpaces( p );
        if ( fFirstTime && *p->pCur == '|' )
        {
            fFirstTime = 0;
            *p->pCur = ' ';
            while ( *p->pCur && *p->pCur != '|' )
                *p->pCur++ = ' ';
            if ( *p->pCur == '|' )
                *p->pCur = ' ';
            continue;
        }
        if ( *p->pCur == '(' )
        {
            // add new node at this depth
            //assert( Vec_WecSize(&p->vDepth) >= Vec_IntSize(&p->vStack) );
            //if ( Vec_WecSize(&p->vDepth) == Vec_IntSize(&p->vStack) )
            //    Vec_WecPushLevel(&p->vDepth);
            //Vec_WecPush( &p->vDepth, Vec_IntSize(&p->vStack), Vec_WecSize(&p->vObjs) );
            // add fanin to node on the previous level
            Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(Vec_WecSize(&p->vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( &p->vStack, Vec_WecSize(&p->vObjs) );
            Vec_WecPushLevel( &p->vObjs );
        }
        else if ( *p->pCur == ')' )
        {
            Vec_IntPop( &p->vStack );
        }
        else  // token
        {
            char * pStart = p->pCur; 
            Smt_PrsSkipNonSpaces( p );
            if ( p->pCur < p->pLimit )
            {
                // remove strange characters (this can lead to name clashes)
                int iToken;
                /* commented out for SMT comp
                char * pTemp;
                if ( *pStart == '?' )
                    *pStart = '_';
                for ( pTemp = pStart; pTemp < p->pCur; pTemp++ )
                    if ( *pTemp == '.' )
                        *pTemp = '_';*/
                // create and save token for this string
                iToken = Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur--, NULL );
                Vec_IntPush( Vec_WecEntry(&p->vObjs, Vec_IntEntryLast(&p->vStack)), Abc_Var2Lit(iToken, 1) );
            }
        }
    }
    assert( Vec_IntSize(&p->vStack) == 1 );
    assert( Vec_WecSize(&p->vObjs) == Vec_WecCap(&p->vObjs) );
    p->nDigits = Abc_Base16Log( Vec_WecSize(&p->vObjs) );
}